

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

int add_shape_property(JSContext *ctx,JSShape **psh,JSObject *p,JSAtom atom,int prop_flags)

{
  int iVar1;
  JSAtom JVar2;
  BOOL BVar3;
  JSShapeProperty *pJVar4;
  ulong uVar5;
  uint32_t *puVar6;
  uint32_t in_ECX;
  long *in_RSI;
  uint32_t in_R8D;
  uint32_t unaff_retaddr;
  JSObject *in_stack_00000008;
  intptr_t h;
  uint32_t new_shape_hash;
  uint32_t hash_mask;
  JSShapeProperty *prop;
  JSShapeProperty *pr;
  JSShape *sh;
  JSRuntime *rt;
  JSShape *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  JSShape *in_stack_ffffffffffffffa8;
  uint32_t uVar7;
  uint in_stack_ffffffffffffffb4;
  JSShape *local_38;
  
  local_38 = (JSShape *)*in_RSI;
  uVar7 = 0;
  if (local_38->is_hashed != '\0') {
    js_shape_hash_unlink
              ((JSRuntime *)((ulong)in_stack_ffffffffffffffb4 << 0x20),in_stack_ffffffffffffffa8);
    uVar7 = shape_hash(local_38->hash,in_ECX);
    uVar7 = shape_hash(uVar7,in_R8D);
  }
  JVar2 = (JSAtom)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  if (local_38->prop_size <= local_38->prop_count) {
    iVar1 = resize_properties(_new_shape_hash,(JSShape **)h,in_stack_00000008,unaff_retaddr);
    if (iVar1 != 0) {
      if (local_38->is_hashed != '\0') {
        js_shape_hash_link((JSRuntime *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                           in_stack_ffffffffffffff98);
      }
      return -1;
    }
    local_38 = (JSShape *)*in_RSI;
  }
  if (local_38->is_hashed != '\0') {
    local_38->hash = uVar7;
    js_shape_hash_link((JSRuntime *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
  }
  pJVar4 = get_shape_prop(local_38);
  iVar1 = local_38->prop_count;
  local_38->prop_count = iVar1 + 1;
  pJVar4 = pJVar4 + iVar1;
  JVar2 = JS_DupAtom((JSContext *)CONCAT44(in_stack_ffffffffffffffb4,uVar7),JVar2);
  pJVar4->atom = JVar2;
  *(uint *)pJVar4 = *(uint *)pJVar4 & 0x3ffffff | in_R8D << 0x1a;
  BVar3 = __JS_AtomIsTaggedInt(in_ECX);
  local_38->has_small_array_index = local_38->has_small_array_index | (byte)BVar3;
  uVar5 = (ulong)(in_ECX & local_38->prop_hash_mask);
  puVar6 = prop_hash_end(local_38);
  *(uint *)pJVar4 = *(uint *)pJVar4 & 0xfc000000 | puVar6[-1 - uVar5] & 0x3ffffff;
  uVar7 = local_38->prop_count;
  puVar6 = prop_hash_end(local_38);
  puVar6[-1 - uVar5] = uVar7;
  return 0;
}

Assistant:

static int add_shape_property(JSContext *ctx, JSShape **psh,
                              JSObject *p, JSAtom atom, int prop_flags)
{
    JSRuntime *rt = ctx->rt;
    JSShape *sh = *psh;
    JSShapeProperty *pr, *prop;
    uint32_t hash_mask, new_shape_hash = 0;
    intptr_t h;

    /* update the shape hash */
    if (sh->is_hashed) {
        js_shape_hash_unlink(rt, sh);
        new_shape_hash = shape_hash(shape_hash(sh->hash, atom), prop_flags);
    }

    if (unlikely(sh->prop_count >= sh->prop_size)) {
        if (resize_properties(ctx, psh, p, sh->prop_count + 1)) {
            /* in case of error, reinsert in the hash table.
               sh is still valid if resize_properties() failed */
            if (sh->is_hashed)
                js_shape_hash_link(rt, sh);
            return -1;
        }
        sh = *psh;
    }
    if (sh->is_hashed) {
        sh->hash = new_shape_hash;
        js_shape_hash_link(rt, sh);
    }
    /* Initialize the new shape property.
       The object property at p->prop[sh->prop_count] is uninitialized */
    prop = get_shape_prop(sh);
    pr = &prop[sh->prop_count++];
    pr->atom = JS_DupAtom(ctx, atom);
    pr->flags = prop_flags;
    sh->has_small_array_index |= __JS_AtomIsTaggedInt(atom);
    /* add in hash table */
    hash_mask = sh->prop_hash_mask;
    h = atom & hash_mask;
    pr->hash_next = prop_hash_end(sh)[-h - 1];
    prop_hash_end(sh)[-h - 1] = sh->prop_count;
    return 0;
}